

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  _Base_ptr *__k;
  pointer pcVar1;
  bool bVar2;
  undefined4 uVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  istream *piVar10;
  ostream *poVar11;
  _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
  *this;
  mapped_type *pmVar12;
  _Node *p_Var13;
  mapped_type *pmVar14;
  iterator iVar15;
  _Base_ptr p_Var16;
  double dVar17;
  _Self __tmp_1;
  long lVar18;
  char *pcVar19;
  _Self __tmp;
  ulong uVar20;
  size_t *psVar21;
  size_t *psVar22;
  undefined8 *puVar23;
  int iVar24;
  bool bVar25;
  undefined1 local_228 [8];
  graph_t graph;
  nodes_t nodes;
  node2name_t n2n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  lengths;
  edges_list_t result;
  string sa1;
  string sa2;
  undefined1 local_100 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  rgraph;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  processed;
  edges_list_t to_visit;
  string n2;
  int local_5c;
  mapped_type mStack_58;
  int count;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  
  result.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)&sa1._M_string_length;
  sa1._M_dataplus._M_p = (pointer)0x0;
  sa1._M_string_length._0_1_ = 0;
  sa1.field_2._8_8_ = &sa2._M_string_length;
  sa2._M_dataplus._M_p = (pointer)0x0;
  sa2._M_string_length._0_1_ = 0;
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'X');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,
             (string *)
             &result.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size,cVar4);
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'X');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(sa1.field_2._M_local_buf + 8),cVar4);
  std::istream::operator>>((istream *)&std::cin,&local_5c);
  std::istream::ignore();
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nodes;
  dVar17 = 0.0;
  nodes._M_t._M_impl._0_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&n2n;
  n2n._M_t._M_impl._0_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&graph;
  graph._M_t._M_impl._0_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&lengths;
  lengths._M_t._M_impl._0_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  bVar2 = 0 < local_5c;
  graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       n2n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_5c < 1) {
    n2.field_2._8_8_ = 0;
  }
  else {
    n2.field_2._8_8_ = 0;
    iVar24 = 0;
    do {
      local_100 = (undefined1  [8])&rgraph._M_t._M_impl.super__Rb_tree_header;
      sa2.field_2._8_4_ = iVar24;
      rgraph._M_t._M_impl._0_8_ = 0;
      rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'X');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_100,cVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50,9,
               (allocator_type *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
      lVar18 = 0;
      uVar20 = 0;
      mStack_58 = 0.0;
      do {
        lVar6 = std::__cxx11::string::find('\0',0x2c);
        if (lVar6 == -1) {
          n2.field_2._8_8_ = 0xffffffff;
        }
        else {
          psVar22 = &rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::__cxx11::string::substr((ulong)psVar22,(ulong)local_100);
          std::__cxx11::string::operator=((string *)((long)local_50 + lVar18),(string *)psVar22);
          if ((_Rb_tree_header *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              &processed._M_t._M_impl.super__Rb_tree_header) {
            operator_delete((void *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            processed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
          }
          dVar17 = -NAN;
          std::__cxx11::string::substr((ulong)psVar22,(ulong)local_100);
          std::__cxx11::string::operator=((string *)local_100,(string *)psVar22);
          if ((_Rb_tree_header *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              &processed._M_t._M_impl.super__Rb_tree_header) {
            operator_delete((void *)rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            processed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
          }
        }
        if (lVar6 == -1) break;
        bVar25 = 6 < uVar20;
        uVar20 = uVar20 + 1;
        dVar17 = (double)CONCAT71((int7)((ulong)dVar17 >> 8),bVar25);
        lVar18 = lVar18 + 0x20;
        mStack_58 = dVar17;
      } while (uVar20 != 8);
      if (((ulong)mStack_58 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
        if (local_100 != (undefined1  [8])&rgraph._M_t._M_impl.super__Rb_tree_header) {
          operator_delete((void *)local_100,
                          rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
        }
        break;
      }
      std::__cxx11::string::_M_assign((string *)((long)local_50 + 0x100));
      unquote((string *)((long)local_50 + 0x20));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)local_50);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      mStack_58 = get_number((string *)((long)local_50 + 0x60));
      dVar17 = get_number((string *)((long)local_50 + 0x80));
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                             *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)local_50);
      pmVar8->first = mStack_58;
      pmVar8->second = dVar17;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)local_228,(key_type *)local_50);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)local_50);
      dVar17 = -1.0;
      *pmVar9 = -1.0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
      uVar3 = sa2.field_2._8_4_;
      if (local_100 != (undefined1  [8])&rgraph._M_t._M_impl.super__Rb_tree_header) {
        operator_delete((void *)local_100,
                        rgraph._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      iVar24 = uVar3 + 1;
      bVar2 = iVar24 < local_5c;
    } while (iVar24 < local_5c);
  }
  iVar24 = (int)n2.field_2._8_8_;
  if (!bVar2) {
    std::istream::operator>>((istream *)&std::cin,&local_5c);
    std::istream::ignore();
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&rgraph;
    rgraph._M_t._M_impl._0_8_ = rgraph._M_t._M_impl._0_8_ & 0xffffffff00000000;
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         rgraph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (0 < local_5c) {
      iVar24 = 0;
      do {
        local_50 = (undefined1  [8])
                   &parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        to_visit.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size = (size_t)&n2._M_string_length;
        n2._M_dataplus._M_p = (pointer)0x0;
        n2._M_string_length._0_1_ = 0;
        piVar10 = std::operator>>((istream *)&std::cin,(string *)local_50);
        std::operator>>(piVar10,(string *)
                                &to_visit.
                                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl._M_node._M_size);
        std::istream::ignore();
        iVar5 = std::__cxx11::string::compare((char *)local_50);
        if (iVar5 == 0) {
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(char *)local_50,
                               (long)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)to_visit.
                                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl._M_node._M_size,(long)n2._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        this = (_Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                *)local_228,(key_type *)local_50);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_50);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                                *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type *)
                               &to_visit.
                                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl._M_node._M_size);
        mStack_58 = pmVar8->first;
        n2.field_2._8_8_ = pmVar12->second - pmVar8->second;
        sa2.field_2._8_8_ = pmVar12->first;
        dVar17 = cos((mStack_58 + (double)sa2.field_2._8_8_) * 0.5);
        dVar17 = dVar17 * (double)n2.field_2._8_8_ * dVar17 * (double)n2.field_2._8_8_ +
                 ((double)sa2.field_2._8_8_ - mStack_58) * ((double)sa2.field_2._8_8_ - mStack_58);
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(dVar17 * 6371.0);
        processed._M_t._M_impl._0_8_ =
             &processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&processed,
                   to_visit.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size,
                   n2._M_dataplus._M_p +
                   to_visit.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size);
        std::
        _Rb_tree<std::pair<double,std::__cxx11::string>,std::pair<double,std::__cxx11::string>,std::_Identity<std::pair<double,std::__cxx11::string>>,std::less<std::pair<double,std::__cxx11::string>>,std::allocator<std::pair<double,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<double,std::__cxx11::string>>
                  (this,(pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if ((_Base_ptr *)processed._M_t._M_impl._0_8_ !=
            &processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)processed._M_t._M_impl._0_8_,
                          (ulong)((long)&(processed._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((size_type *)
            to_visit.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size != &n2._M_string_length) {
          operator_delete((void *)to_visit.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,
                          CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
        }
        if (local_50 !=
            (undefined1  [8])
            &parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)local_50,
                          CONCAT71(parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                   parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
        }
        iVar24 = iVar24 + 1;
      } while (iVar24 < local_5c);
    }
    processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&processed;
    processed._M_t._M_impl._0_8_ = processed._M_t._M_impl._0_8_ & 0xffffffff00000000;
    processed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    processed._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    processed._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    processed._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
    to_visit.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    processed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         processed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    to_visit.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var13 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<std::__cxx11::string_const&>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         processed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size);
    std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
    to_visit.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)
         ((long)&(to_visit.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &result.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)
                          &result.
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl._M_node._M_size);
    *pmVar9 = 0.0;
    if ((size_t *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &processed._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      psVar22 = &n2n._M_t._M_impl.super__Rb_tree_header._M_node_count;
      do {
        psVar21 = &graph._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_50 = (undefined1  [8])
                   &parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,
                   *(long *)(processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                   *(long *)(processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18) +
                   *(long *)(processed._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
        for (puVar23 = (undefined8 *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
            puVar23 != &processed._M_t._M_impl.super__Rb_tree_header._M_node_count;
            puVar23 = (undefined8 *)*puVar23) {
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar22,(key_type *)local_50);
          mStack_58 = *pmVar9;
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar22,(key_type *)(puVar23 + 2));
          if (*pmVar9 <= mStack_58 && mStack_58 != *pmVar9) {
            std::__cxx11::string::_M_assign((string *)local_50);
          }
        }
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::remove((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count,(char *)local_50);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)psVar22,(key_type *)local_50);
        iVar24 = main::C;
        n2.field_2._8_8_ = *pmVar9;
        main::C = main::C + 1;
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,". check node ",0xd);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)local_50);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)psVar21,(key_type *)local_50);
        poVar11 = std::ostream::_M_insert<double>(pmVar8->first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
                               *)psVar21,(key_type *)local_50);
        poVar11 = std::ostream::_M_insert<double>(pmVar8->second);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                *)local_228,(key_type *)local_50);
        for (p_Var16 = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                    *)local_228,(key_type *)local_50),
            (_Rb_tree_header *)p_Var16 != &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          __k = &p_Var16[1]._M_parent;
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)__k);
          if ((_Base_ptr)&processed == iVar15._M_node) {
            p_Var13 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                      ::_M_create_node<std::__cxx11::string_const&>
                                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                                 &processed._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
            std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
            to_visit.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&(to_visit.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          }
          mStack_58 = *(mapped_type *)(p_Var16 + 1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"w = ",4);
          poVar11 = std::ostream::_M_insert<double>((double)n2.field_2._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\td = ",5);
          poVar11 = std::ostream::_M_insert<double>(mStack_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tcurrent (",10);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (key_type *)__k);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(pmVar7->_M_dataplus)._M_p,pmVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"): ",3);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar22,(key_type *)__k);
          poVar11 = std::ostream::_M_insert<double>(*pmVar9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                 *)psVar22,(key_type *)__k);
          if ((*pmVar9 != -1.0) || (NAN(*pmVar9))) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)psVar22,(key_type *)__k);
            lVar18 = 4;
            pcVar19 = "skip";
            if ((double)n2.field_2._8_8_ + mStack_58 < *pmVar9) goto LAB_00105fd7;
          }
          else {
LAB_00105fd7:
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                   *)psVar22,(key_type *)__k);
            *pmVar9 = mStack_58 + (double)n2.field_2._8_8_;
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_100,(key_type *)__k);
            lVar18 = 0xb;
            std::__cxx11::string::_M_assign((string *)pmVar7);
            pcVar19 = "update path";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar19,lVar18);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
        if (local_50 !=
            (undefined1  [8])
            &parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)local_50,
                          CONCAT71(parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                   parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
        }
      } while ((size_t *)processed._M_t._M_impl.super__Rb_tree_header._M_node_count !=
               &processed._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if (lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&lengths) {
      p_Var16 = lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)(p_Var16 + 1));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pmVar7->_M_dataplus)._M_p,
                             pmVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
        poVar11 = std::ostream::_M_insert<double>(*(double *)(p_Var16 + 2));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Rb_tree_node_base *)&lengths);
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)((long)&sa1.field_2 + 8));
    if ((*pmVar9 != -1.0) || (NAN(*pmVar9))) {
      lengths._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
      result.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      local_50 = (undefined1  [8])
                 &parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      result.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,sa1.field_2._8_8_,sa2._M_dataplus._M_p + sa1.field_2._8_8_);
      p_Var13 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_create_node<std::__cxx11::string_const&>
                          ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &lengths._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&sa1.field_2 + 8));
      std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
      psVar21 = &lengths._M_t._M_impl.super__Rb_tree_header._M_node_count;
      result.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&(result.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
      psVar22 = &to_visit.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size;
      while (((pointer)sa1._M_dataplus._M_p !=
              parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ||
             ((sa1._M_dataplus._M_p != (pointer)0x0 &&
              (iVar24 = bcmp((void *)result.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node._M_size,(void *)local_50,
                             (size_t)sa1._M_dataplus._M_p), iVar24 != 0))))) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_100,(key_type *)local_50);
        pcVar1 = (pmVar7->_M_dataplus)._M_p;
        to_visit.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size = (size_t)&n2._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar22,pcVar1,pcVar1 + pmVar7->_M_string_length);
        p_Var13 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_create_node<std::__cxx11::string_const&>
                            ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             psVar21,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)psVar22);
        std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
        result.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             (_List_node_base *)
             ((long)&(result.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
        std::__cxx11::string::_M_assign((string *)local_50);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)psVar22);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pmVar7->_M_dataplus)._M_p,
                             pmVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,":\t",2);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)to_visit.
                                             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl._M_node._M_size,(long)n2._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((size_type *)
            to_visit.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size != &n2._M_string_length) {
          operator_delete((void *)to_visit.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,
                          CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
        }
      }
      psVar22 = psVar21;
      while (psVar22 = (size_t *)*psVar22, psVar22 != psVar21) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)(psVar22 + 2));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pmVar7->_M_dataplus)._M_p,
                             pmVar7->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      if (local_50 !=
          (undefined1  [8])
          &parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_50,
                        CONCAT71(parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                 parts.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) + 1);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lengths._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"IMPOSSIBLE",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&processed._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rgraph._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_100);
    iVar24 = 0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)&n2n._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)local_228);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<double,_double>_>_>_>
               *)&graph._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((size_type *)sa1.field_2._8_8_ != &sa2._M_string_length) {
    operator_delete((void *)sa1.field_2._8_8_,
                    CONCAT71(sa2._M_string_length._1_7_,(undefined1)sa2._M_string_length) + 1);
  }
  if ((size_type *)
      result.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != &sa1._M_string_length) {
    operator_delete((void *)result.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size,
                    CONCAT71(sa1._M_string_length._1_7_,(undefined1)sa1._M_string_length) + 1);
  }
  return iVar24;
}

Assistant:

int main()
{
        std::string sa1, sa2;
        getline(std::cin, sa1);
        getline(std::cin, sa2);
        int count;
        std::cin >> count;
        std::cin.ignore();

        // Read nodes
        typedef std::map<std::string, std::pair<double, double> > nodes_t;
        typedef std::map<std::string, std::string> node2name_t;

        nodes_t nodes;
        node2name_t n2n;

        graph_t graph;
        std::map<std::string, double> lengths;
        for (int i = 0; i < count; i++)
        {
            std::string line;
            getline(std::cin, line);

            std::vector<std::string> parts(9);
            for (int i = 0; i < 9 - 1; i++)
            {
                size_t pos = line.find(',');
                if (pos == std::string::npos)
                {
                    //std::cout << "Invalid format: " << line << std::endl;
                    return -1;
                }
                parts[i] = line.substr(0, pos);
                line = line.substr(pos + 1);
                //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
            }
            parts[8] = line;
            unquote(parts[1]);
            n2n[parts[0]] = parts[1];
            nodes[parts[0]] = nodes_t::mapped_type(get_number(parts[3]), get_number(parts[4]));
            graph[parts[0]];
            lengths[parts[0]] = -1.0;
            //cerr << parts[1] << ": " << get_number(parts[3]) << ", " << get_number(parts[4]) << endl;
            //std::cerr << parts[0] << ": " << nodes[parts[0]].first << ", " << nodes[parts[0]].second << std::endl;
        }

        // Read edges
        std::cin >> count;
        std::cin.ignore();
        std::map<std::string, std::string> rgraph;
        for (int i = 0; i < count; i++)
        {
            std::string n1, n2;
            std::cin >> n1 >> n2;
            std::cin.ignore();
            if (n1 == "StopArea:AMER")
            {
                std::cerr << n1 << " " << n2 << std::endl;
            }
            graph[n1].insert(std::pair<double, edge_t>(_distance(nodes[n1], nodes[n2]), n2));
        }

        std::set<std::string> processed;
        edges_list_t to_visit;
        to_visit.push_back(sa1);
        processed.insert(sa1);
        lengths[sa1] = 0.0;
        while (!to_visit.empty())
        {
            std::string e = to_visit.front();
            for (edges_list_t::const_iterator i = to_visit.begin(); i != to_visit.end(); i++)
            {
                if (lengths[e] > lengths[*i])
                {
                    e = *i;
                }
            }
            to_visit.remove(e);
            double w = lengths[e];
            static int C = 1;
            std::cerr << C++ << ". check node " << n2n[e] << ": " << nodes[e].first << ", " << nodes[e].second << std::endl;
            for (edges_set_t::const_iterator i = graph[e].begin(); i != graph[e].end(); i++)
            {
                if (processed.end() == processed.find(i->second))
                {
                    to_visit.push_back(i->second);
                    processed.insert(i->second);
                }
                double d = i->first;
                std::cerr << "w = " << w << "\td = " << d << "\tcurrent (" << n2n[i->second] << "): " << lengths[i->second] << std::endl;
                if (-1.0 == lengths[i->second]
                    || w + d < lengths[i->second])
                {
                    lengths[i->second] = w + d;
                    rgraph[i->second] = e;
                    std::cerr << "update path" << std::endl;
                } else
                {
                    std::cerr << "skip" << std::endl;
                }
            }
        }

        for (std::map<std::string, double>::const_iterator i = lengths.begin(); i != lengths.end(); i++)
        {
            std::cerr << n2n[i->first] << ": " << i->second << std::endl;
        }

        // Build path
        if (-1.0 == lengths[sa2])
        {
            std::cout << "IMPOSSIBLE" << std::endl;
        } else
        {
            edges_list_t result;
            std::string n = sa2;
            result.push_front(sa2);
            while (sa1 != n)
            {
                std::string nmin = rgraph[n];
                result.push_front(nmin);
                n = nmin;
                std::cerr << n2n[nmin] << ":\t" << nmin << std::endl;
            }

            for (edges_list_t::const_iterator i = result.begin(); i != result.end(); i++)
            {
                std::cout << n2n[*i] << std::endl;
            }
        }

        return 0;
}